

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandOutdec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLits;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nLits = 1;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Lvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        if (pAVar2->ntkType == ABC_NTK_STRASH) {
          pAVar2 = Abc_NtkDarOutdec(pAVar2,nLits,fVerbose);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          Abc_Print(-1,"Command has failed.\n");
          return 0;
        }
        pcVar3 = "Only works for strashed networks.\n";
      }
      iVar4 = -1;
      goto LAB_001fc828;
    }
    if (iVar1 != 0x4c) goto LAB_001fc7c0;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_001fc7c0;
    }
    nLits = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (0xfffffffd < nLits - 3);
  Abc_Print(1,"Currently, command \"outdec\" works for 1-lit and 2-lit primes only.\n");
LAB_001fc7c0:
  iVar4 = -2;
  Abc_Print(-2,"usage: outdec [-Lvh]\n");
  Abc_Print(-2,"\t         performs prime decomposition of the first output\n");
  Abc_Print(-2,"\t-L num : the number of literals in the primes [default = %d]\n",(ulong)nLits);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  pcVar3 = "\t-h     : print the command usage\n";
LAB_001fc828:
  Abc_Print(iVar4,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandOutdec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkDarOutdec( Abc_Ntk_t * pNtk, int nLits, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int c, nLits = 1;
    int fVerbose = 0;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLits = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLits < 1 || nLits > 2 )
            {
                Abc_Print( 1,"Currently, command \"outdec\" works for 1-lit and 2-lit primes only.\n" );
                goto usage;
            }
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDarOutdec( pNtk, nLits, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: outdec [-Lvh]\n" );
    Abc_Print( -2, "\t         performs prime decomposition of the first output\n" );
    Abc_Print( -2, "\t-L num : the number of literals in the primes [default = %d]\n", nLits );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}